

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

bool __thiscall
cmRuntimeDependencyArchive::IsPreExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  bool bVar1;
  anon_class_8_1_60cb577c regexSearch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  anon_class_8_1_60cb577c local_260;
  undefined1 local_258 [40];
  undefined1 local_230 [520];
  
  memset(local_230,0,0x208);
  local_258._0_8_ = local_230;
  std::__cxx11::string::string((string *)(local_258 + 8),(string *)name);
  local_260.regexMatch = (anon_class_40_2_f7e7401d_for__M_pred *)local_258;
  bVar1 = IsPreExcluded::anon_class_8_1_60cb577c::operator()(&local_260,&this->PreIncludeRegexes);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = IsPreExcluded::anon_class_8_1_60cb577c::operator()(&local_260,&this->PreExcludeRegexes);
  }
  std::__cxx11::string::~string((string *)(local_258 + 8));
  return bVar1;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPreExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };

  return !regexSearch(this->PreIncludeRegexes) &&
    regexSearch(this->PreExcludeRegexes);
}